

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_differencer.cc
# Opt level: O1

void __thiscall
google::protobuf::util::MessageDifferencer::TreatAsMapUsingKeyComparator
          (MessageDifferencer *this,FieldDescriptor *field,MapKeyComparator *key_comparator)

{
  _Rb_tree_header *p_Var1;
  LogMessage *pLVar2;
  _Base_ptr p_Var3;
  mapped_type *pmVar4;
  mapped_type *ppMVar5;
  _Base_ptr p_Var6;
  LogMessage local_b0;
  LogMessage local_78;
  FieldDescriptor *local_40;
  FieldDescriptor *field_local;
  
  local_40 = field;
  if (*(int *)(field + 0x3c) != 3) {
    protobuf::internal::LogMessage::LogMessage
              (&local_b0,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O1/src/src/google/protobuf/util/message_differencer.cc"
               ,0x1ad);
    pLVar2 = protobuf::internal::LogMessage::operator<<
                       (&local_b0,"CHECK failed: field->is_repeated(): ");
    pLVar2 = protobuf::internal::LogMessage::operator<<(pLVar2,"Field must be repeated: ");
    pLVar2 = protobuf::internal::LogMessage::operator<<(pLVar2,*(string **)(local_40 + 8));
    protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_78,pLVar2);
    protobuf::internal::LogMessage::~LogMessage(&local_b0);
  }
  p_Var1 = &(this->repeated_field_comparisons_)._M_t._M_impl.super__Rb_tree_header;
  p_Var6 = (this->repeated_field_comparisons_)._M_t._M_impl.super__Rb_tree_header._M_header.
           _M_parent;
  p_Var3 = &p_Var1->_M_header;
  for (; p_Var6 != (_Base_ptr)0x0;
      p_Var6 = (&p_Var6->_M_left)[*(FieldDescriptor **)(p_Var6 + 1) < local_40]) {
    if (*(FieldDescriptor **)(p_Var6 + 1) >= local_40) {
      p_Var3 = p_Var6;
    }
  }
  p_Var6 = &p_Var1->_M_header;
  if (((_Rb_tree_header *)p_Var3 != p_Var1) &&
     (p_Var6 = p_Var3, local_40 < *(FieldDescriptor **)(p_Var3 + 1))) {
    p_Var6 = &p_Var1->_M_header;
  }
  if ((_Rb_tree_header *)p_Var6 != p_Var1) {
    protobuf::internal::LogMessage::LogMessage
              (&local_78,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O1/src/src/google/protobuf/util/message_differencer.cc"
               ,0x1b0);
    pLVar2 = protobuf::internal::LogMessage::operator<<
                       (&local_78,
                        "CHECK failed: repeated_field_comparisons_.find(field) == repeated_field_comparisons_.end(): "
                       );
    pLVar2 = protobuf::internal::LogMessage::operator<<
                       (pLVar2,"Cannot treat the same field as both ");
    pmVar4 = std::
             map<const_google::protobuf::FieldDescriptor_*,_google::protobuf::util::MessageDifferencer::RepeatedFieldComparison,_std::less<const_google::protobuf::FieldDescriptor_*>,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_google::protobuf::util::MessageDifferencer::RepeatedFieldComparison>_>_>
             ::operator[](&this->repeated_field_comparisons_,&local_40);
    pLVar2 = protobuf::internal::LogMessage::operator<<(pLVar2,*pmVar4);
    pLVar2 = protobuf::internal::LogMessage::operator<<(pLVar2," and MAP. Field name is: ");
    pLVar2 = protobuf::internal::LogMessage::operator<<(pLVar2,*(string **)(local_40 + 8));
    protobuf::internal::LogFinisher::operator=((LogFinisher *)((long)&field_local + 7),pLVar2);
    protobuf::internal::LogMessage::~LogMessage(&local_78);
  }
  ppMVar5 = std::
            map<const_google::protobuf::FieldDescriptor_*,_const_google::protobuf::util::MessageDifferencer::MapKeyComparator_*,_std::less<const_google::protobuf::FieldDescriptor_*>,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_const_google::protobuf::util::MessageDifferencer::MapKeyComparator_*>_>_>
            ::operator[](&this->map_field_key_comparator_,&local_40);
  *ppMVar5 = key_comparator;
  return;
}

Assistant:

void MessageDifferencer::TreatAsMapUsingKeyComparator(
    const FieldDescriptor* field, const MapKeyComparator* key_comparator) {
  GOOGLE_CHECK(field->is_repeated())
      << "Field must be repeated: " << field->full_name();
  GOOGLE_CHECK(repeated_field_comparisons_.find(field) ==
        repeated_field_comparisons_.end())
      << "Cannot treat the same field as both "
      << repeated_field_comparisons_[field]
      << " and MAP. Field name is: " << field->full_name();
  map_field_key_comparator_[field] = key_comparator;
}